

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cc
# Opt level: O1

void __thiscall p2t::Triangle::MarkNeighbor(Triangle *this,Triangle *t)

{
  Point *pPVar1;
  Point *pPVar2;
  Point *pPVar3;
  Point *pPVar4;
  Point *p2;
  Point *p1;
  
  pPVar1 = this->points_[1];
  p2 = this->points_[2];
  pPVar2 = t->points_[0];
  pPVar3 = t->points_[1];
  pPVar4 = t->points_[2];
  if ((pPVar4 != pPVar1 && (pPVar3 != pPVar1 && pPVar2 != pPVar1)) ||
     (pPVar4 != p2 && (pPVar3 != p2 && pPVar2 != p2))) {
    p1 = this->points_[0];
    if (pPVar4 != p1 && (pPVar3 != p1 && pPVar2 != p1)) {
      return;
    }
    if (pPVar4 == p2 || (pPVar3 == p2 || pPVar2 == p2)) {
      this->neighbors_[1] = t;
    }
    else {
      if (pPVar4 != p1 && (pPVar3 != p1 && pPVar2 != p1) ||
          (pPVar3 != pPVar1 && pPVar2 != pPVar1) && pPVar4 != pPVar1) {
        return;
      }
      this->neighbors_[2] = t;
      p2 = pPVar1;
    }
  }
  else {
    this->neighbors_[0] = t;
    p1 = pPVar1;
  }
  MarkNeighbor(t,p1,p2,this);
  return;
}

Assistant:

void Triangle::MarkNeighbor(Triangle& t)
{
  if (t.Contains(points_[1], points_[2])) {
    neighbors_[0] = &t;
    t.MarkNeighbor(points_[1], points_[2], this);
  } else if (t.Contains(points_[0], points_[2])) {
    neighbors_[1] = &t;
    t.MarkNeighbor(points_[0], points_[2], this);
  } else if (t.Contains(points_[0], points_[1])) {
    neighbors_[2] = &t;
    t.MarkNeighbor(points_[0], points_[1], this);
  }
}